

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_polygon.c
# Opt level: O0

void rclick(int mx,int my)

{
  int iVar1;
  int in_ESI;
  int in_EDI;
  int i;
  
  iVar1 = hit_vertex(in_EDI,in_ESI);
  if ((-1 < iVar1) && (ex.add_hole == NOT_ADDING_HOLE)) {
    ex.vertex_count = ex.vertex_count + -1;
    memmove(ex.vertices + iVar1,ex.vertices + (iVar1 + 1),(long)(ex.vertex_count - iVar1) << 3);
    memmove(ex.vertex_polygon + iVar1,ex.vertex_polygon + (iVar1 + 1),
            (long)(ex.vertex_count - iVar1) << 2);
  }
  ex.cur_vertex = -1;
  return;
}

Assistant:

static void rclick(int mx, int my)
{
   const int i = hit_vertex(mx, my);
   if (i >= 0 && ex.add_hole == NOT_ADDING_HOLE) {
      ex.vertex_count--;
      memmove(&ex.vertices[i], &ex.vertices[i + 1],
         sizeof(Vertex) * (ex.vertex_count - i));
      memmove(&ex.vertex_polygon[i], &ex.vertex_polygon[i + 1],
         sizeof(int) * (ex.vertex_count - i));
   }
   ex.cur_vertex = -1;
}